

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

bool __thiscall r_exec::GMonitor::reduce(GMonitor *this,_Fact *input)

{
  HLPBindingMap *bm;
  PrimaryMDLController *this_00;
  _Object *p_Var1;
  Fact *super_goal;
  MDLController *pMVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  MatchResult MVar6;
  Pred *pPVar7;
  _Fact *p_Var8;
  Sim *sim;
  long *plVar9;
  _Fact *this_01;
  Goal *pGVar10;
  byte bVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_var;
  
  iVar5 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
  bVar11 = 1;
  if ((char)iVar5 != '\0') goto LAB_00169b4b;
  if (((this->injected_goal == false) && (this->predicted_evidence != (_Fact *)0x0)) &&
     (iVar5 = (*(this->predicted_evidence->super_LObject).
                super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                super__Object._vptr__Object[0xe])(), (char)iVar5 != '\0')) {
    bVar11 = 0;
    PMDLController::register_predicted_goal_outcome
              ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
               (Fact *)(this->super__GMonitor).super_Monitor.target.object,
               (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
               (Fact *)(this->super__GMonitor).f_imdl.object,false,this->injected_goal);
    this->predicted_evidence = (_Fact *)0x0;
    this->injected_goal = true;
    goto LAB_00169b4b;
  }
  pPVar7 = _Fact::get_pred(input);
  if (pPVar7 == (Pred *)0x0) {
    pGVar10 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
    bVar3 = Goal::ground_invalidated(pGVar10,input);
    if (bVar3) {
      (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xf])();
      bm = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
      this_00 = (PrimaryMDLController *)(this->super__GMonitor).super_Monitor.controller;
      p_Var1 = (pGVar10->sim).object;
      super_goal = (Fact *)p_Var1[2].refCount.super___atomic_base<long>._M_i;
      bVar3 = *(bool *)((long)&p_Var1[1].refCount.super___atomic_base<long>._M_i + 1);
      fVar12 = _Fact::get_cfd((this->super__GMonitor).goal_target);
      PrimaryMDLController::abduce(this_00,bm,super_goal,bVar3,(double)fVar12);
LAB_001699f8:
      bVar3 = false;
      bVar11 = 1;
    }
    else {
      MVar6 = _Fact::is_evidence(input,(this->super__GMonitor).goal_target);
      if (MVar6 == MATCH_FAILURE) {
        bVar3 = false;
        bVar11 = 0;
      }
      else if (MVar6 == MATCH_SUCCESS_NEGATIVE) {
        pMVar2 = (this->super__GMonitor).super_Monitor.controller;
        bVar3 = false;
        (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
          _vptr__Object[0xf])(pMVar2,(this->super__GMonitor).super_Monitor.target.object,0,input);
        bVar11 = 1;
      }
      else {
        if (MVar6 == MATCH_SUCCESS_POSITIVE) {
          pMVar2 = (this->super__GMonitor).super_Monitor.controller;
          (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0xf])(pMVar2,(this->super__GMonitor).super_Monitor.target.object,1,input);
          goto LAB_001699f8;
        }
        bVar3 = true;
        bVar11 = 1;
      }
    }
  }
  else {
    p_Var8 = Pred::get_target(pPVar7);
    if ((this->super__GMonitor).simulating == 0) {
      MVar6 = _Fact::is_evidence(p_Var8,(this->super__GMonitor).goal_target);
      if (MVar6 != MATCH_FAILURE) {
        if (MVar6 == MATCH_SUCCESS_NEGATIVE) {
          bVar3 = false;
          PMDLController::register_predicted_goal_outcome
                    ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                     (Fact *)(this->super__GMonitor).super_Monitor.target.object,
                     (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
                     (Fact *)(this->super__GMonitor).f_imdl.object,false,this->injected_goal);
          this->predicted_evidence = (_Fact *)0x0;
          this->injected_goal = true;
          iVar5 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
          bVar11 = (byte)iVar5;
          goto joined_r0x001699ff;
        }
        if (MVar6 != MATCH_SUCCESS_POSITIVE) goto LAB_00169b27;
        if (this->injected_goal == true) {
          PMDLController::register_predicted_goal_outcome
                    ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                     (Fact *)(this->super__GMonitor).super_Monitor.target.object,
                     (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
                     (Fact *)(this->super__GMonitor).f_imdl.object,true,true);
        }
        if (this->predicted_evidence != (_Fact *)0x0) {
          fVar12 = _Fact::get_cfd(p_Var8);
          pPVar7 = _Fact::get_pred(this->predicted_evidence);
          p_Var8 = Pred::get_target(pPVar7);
          fVar13 = _Fact::get_cfd(p_Var8);
          if (fVar13 < fVar12) {
            this->predicted_evidence = input;
          }
        }
      }
LAB_00169b22:
      bVar3 = false;
    }
    else {
      sim = Pred::get_simulation
                      (pPVar7,(Controller *)(this->super__GMonitor).super_Monitor.target.object);
      if (sim == (Sim *)0x0) goto LAB_00169b22;
      iVar5 = (*(p_Var8->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(p_Var8,0);
      plVar9 = (long *)CONCAT44(extraout_var,iVar5);
      (**(code **)(*plVar9 + 0x20))(plVar9,0);
      sVar4 = r_code::Atom::asOpcode();
      if (sVar4 != Opcodes::Success) {
        MVar6 = _Fact::is_evidence(p_Var8,(this->super__GMonitor).goal_target);
        if (MVar6 != MATCH_FAILURE) {
          if (MVar6 == MATCH_SUCCESS_NEGATIVE) {
            pMVar2 = (this->super__GMonitor).super_Monitor.controller;
            bVar3 = false;
            (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
              _vptr__Object[0x10])
                      (pMVar2,(this->super__GMonitor).super_Monitor.target.object,0,input);
            goto LAB_00169b2a;
          }
          if (MVar6 != MATCH_SUCCESS_POSITIVE) goto LAB_00169b27;
          pMVar2 = (this->super__GMonitor).super_Monitor.controller;
          (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0x10])(pMVar2,(this->super__GMonitor).super_Monitor.target.object,1,input)
          ;
        }
        goto LAB_00169b22;
      }
      this_01 = (_Fact *)(**(code **)(*plVar9 + 0x48))(plVar9,1);
      pGVar10 = _Fact::get_goal(this_01);
      if (pGVar10 != (Goal *)0x0) {
        bVar3 = _Fact::is_fact(p_Var8);
        _GMonitor::store_simulated_outcome(&this->super__GMonitor,pGVar10,sim,bVar3);
        goto LAB_00169b22;
      }
LAB_00169b27:
      bVar3 = true;
    }
LAB_00169b2a:
    bVar11 = 0;
  }
joined_r0x001699ff:
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"reached invalid state!",0x16);
    bVar11 = 0;
  }
LAB_00169b4b:
  return (bool)(bVar11 & 1);
}

Assistant:

bool GMonitor::reduce(_Fact *input)   // executed by a reduction core; invalidation check performed in Monitor::is_alive().
{
    if (target->is_invalidated()) {
        return true;
    }

    if (!injected_goal) {
        if (predicted_evidence && predicted_evidence->is_invalidated()) { // the predicted evidence was wrong.
            ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this will inject the goal.
            predicted_evidence = nullptr;
            injected_goal = true;
            return false;
        }
    }

    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _Fact *_input = prediction->get_target(); // _input is f1->obj.

        if (simulating) { // injected_goal==true.
            Sim *sim = prediction->get_simulation(target);

            if (sim) {
                Code *outcome = _input->get_reference(0);

                if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                    _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                    Goal *affected_goal = f_success->get_goal();

                    if (affected_goal) {
                        store_simulated_outcome(affected_goal, sim, _input->is_fact());
                        return false;
                    }
                } else { // report the simulated outcome: this will inject a simulated prediction of the outcome, to allow any g-monitor deciding on this ground.
                    switch (_input->is_evidence(goal_target)) {
                    case MATCH_SUCCESS_POSITIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, input); // report a simulated success.
                        return false;

                    case MATCH_SUCCESS_NEGATIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, input); // report a simulated failure.
                        return false;

                    case MATCH_FAILURE:
                        return false;
                    }
                }
            } else { // during simulation (SIM_ROOT) if the prediction is actual, positive and comes true, we'll eventually catch an actual evidence; otherwise (positive that does not come true or negative), keep simulating: in any case ignore it.
                return false;
            }
        } else {
            switch (_input->is_evidence(goal_target)) {
            case MATCH_SUCCESS_POSITIVE:
                if (injected_goal) {
                    ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, true, true);    // report a predicted success.
                }

                if (predicted_evidence && _input->get_cfd() > predicted_evidence->get_pred()->get_target()->get_cfd()) { // bias toward cfd instead of age.
                    predicted_evidence = input;
                }

                return false;

            case MATCH_SUCCESS_NEGATIVE:
                ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this may invalidate the target.
                predicted_evidence = nullptr;
                injected_goal = true;
                return target->is_invalidated();

            case MATCH_FAILURE:
                return false;
            }
        }
    } else { // input is an actual fact.
        Goal *g = target->get_goal();

        if (g->ground_invalidated(input)) { // invalidate the goal and abduce from the super-goal.
            target->invalidate();
            ((PrimaryMDLController *)controller)->abduce(bindings, g->sim->super_goal, g->sim->opposite, goal_target->get_cfd());
            return true;
        }

        switch (input->is_evidence(goal_target)) {
        case MATCH_SUCCESS_POSITIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, true, input); // report a success.
            return true;

        case MATCH_SUCCESS_NEGATIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, false, input); // report a failure.
            return true;

        case MATCH_FAILURE:
            return false;
        }
    }

    std::cerr << "reached invalid state!";
    return false;
}